

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O1

unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
__thiscall ApplicationFactory::makeContext(ApplicationFactory *this)

{
  _Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  _Var1;
  long *plVar2;
  _Tuple_impl<0UL,_solitaire::interfaces::Context_*,_std::default_delete<solitaire::interfaces::Context>_>
  _Var3;
  int iVar4;
  long lVar5;
  _Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
  _Var6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
  _Var7;
  Button *this_00;
  unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
  solitaire;
  FoundationPileColliders foundationPileColliders;
  TableauPileColliders tableauPileColliders;
  Position local_c8;
  array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
  local_c0;
  uint local_9c;
  PileId local_98;
  PileId local_94;
  _Tuple_impl<0UL,_solitaire::interfaces::Context_*,_std::default_delete<solitaire::interfaces::Context>_>
  local_90;
  array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>,_7UL>
  local_88;
  
  local_90.super__Head_base<0UL,_solitaire::interfaces::Context_*,_false>._M_head_impl =
       (_Head_base<0UL,_solitaire::interfaces::Context_*,_false>)
       (_Head_base<0UL,_solitaire::interfaces::Context_*,_false>)this;
  makeSolitaire((ApplicationFactory *)&local_c0);
  lVar5 = 0;
  do {
    *(undefined8 *)
     ((long)&local_88._M_elems[0]._M_t.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
             _M_head_impl + lVar5) = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  lVar5 = 0;
  do {
    local_94.t = (uint)lVar5;
    local_88._M_elems[4]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>,_true,_true>
                    )::solitaire::Layout::getFoundationPilePosition(&local_94);
    _Var6.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = (_Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>)
                   operator_new(0x10);
    ::solitaire::colliders::FoundationPileCollider::FoundationPileCollider
              ((FoundationPileCollider *)
               _Var6.
               super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
               ._M_head_impl,(Position *)(local_88._M_elems + 4));
    _Var1.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = local_88._M_elems[lVar5]._M_t.
                   super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   .
                   super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
    ;
    local_88._M_elems[lVar5]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false> =
         _Var6.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
         ._M_head_impl;
    if (_Var1.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
        _M_head_impl != (TableauPileCollider *)0x0) {
      (**(code **)(*(long *)_Var1.
                            super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                            ._M_head_impl + 8))();
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  lVar5 = 0;
  do {
    *(undefined8 *)
     ((long)&local_88._M_elems[4]._M_t.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
             _M_head_impl + lVar5) = 0;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x38);
  lVar5 = 0;
  do {
    local_98.t = (uint)lVar5;
    local_c8 = ::solitaire::Layout::getTableauPilePosition(&local_98);
    local_9c = (uint)lVar5;
    iVar4 = (*(*(_func_int ***)
                local_c0._M_elems[0]._M_t.
                super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                ._M_t.
                super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                .
                super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                ._M_head_impl)[0xe])
                      (local_c0._M_elems[0]._M_t.
                       super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                       .
                       super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                       ._M_head_impl,&local_9c);
    _Var6.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = (_Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>)
                   operator_new(0x18);
    ::solitaire::colliders::TableauPileCollider::TableauPileCollider
              ((TableauPileCollider *)
               _Var6.
               super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
               ._M_head_impl,&local_c8,(TableauPile *)CONCAT44(extraout_var,iVar4));
    _Var1.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = local_88._M_elems[lVar5 + 4]._M_t.
                   super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   .
                   super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
    ;
    local_88._M_elems[lVar5 + 4]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false> =
         _Var6.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
         ._M_head_impl;
    if (_Var1.super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
        _M_head_impl != (TableauPileCollider *)0x0) {
      (**(code **)(*(long *)_Var1.
                            super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                            ._M_head_impl + 8))();
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  iVar4 = (*(*(_func_int ***)
              local_c0._M_elems[0]._M_t.
              super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
              ._M_t.
              super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
              .
              super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
              ._M_head_impl)[0xf])();
  _Var7.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                  )operator_new(0x10);
  ::solitaire::colliders::StockPileCollider::StockPileCollider
            ((StockPileCollider *)
             _Var7.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
             .
             super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
             ._M_head_impl,(StockPile *)CONCAT44(extraout_var_00,iVar4));
  local_c0._M_elems[2]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                    )_Var7.
                     super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                     .
                     super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                     ._M_head_impl;
  _Var7.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                  )operator_new(0x20);
  ::solitaire::Button::Button
            ((Button *)
             _Var7.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
             .
             super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
             ._M_head_impl,&::solitaire::Layout::newGameButtonPosition,
             &::solitaire::Layout::newGameButtonSize);
  local_c0._M_elems[1]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                    )_Var7.
                     super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                     .
                     super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                     ._M_head_impl;
  this_00 = (Button *)operator_new(0x20);
  ::solitaire::Button::Button
            (this_00,&::solitaire::Layout::undoButtonPosition,&::solitaire::Layout::undoButtonSize);
  local_c0._M_elems[3]._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
  _M_head_impl = (__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                  )(__uniq_ptr_data<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>,_true,_true>
                    )this_00;
  std::
  make_unique<solitaire::Context,std::unique_ptr<solitaire::interfaces::Solitaire,std::default_delete<solitaire::interfaces::Solitaire>>,std::array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>>,4ul>,std::array<std::unique_ptr<solitaire::colliders::interfaces::TableauPileCollider,std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>>,7ul>,std::unique_ptr<solitaire::colliders::StockPileCollider,std::default_delete<solitaire::colliders::StockPileCollider>>,std::unique_ptr<solitaire::Button,std::default_delete<solitaire::Button>>,std::unique_ptr<solitaire::Button,std::default_delete<solitaire::Button>>>
            ((unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
              *)&local_c8,&local_c0,&local_88,
             (unique_ptr<solitaire::colliders::StockPileCollider,_std::default_delete<solitaire::colliders::StockPileCollider>_>
              *)(local_88._M_elems + 4),
             (unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> *)
             (local_c0._M_elems + 2),
             (unique_ptr<solitaire::Button,_std::default_delete<solitaire::Button>_> *)
             (local_c0._M_elems + 1));
  _Var3.super__Head_base<0UL,_solitaire::interfaces::Context_*,_false>._M_head_impl =
       local_90.super__Head_base<0UL,_solitaire::interfaces::Context_*,_false>._M_head_impl;
  *(Position *)local_90.super__Head_base<0UL,_solitaire::interfaces::Context_*,_false>._M_head_impl
       = local_c8;
  local_c8.x = 0;
  local_c8.y = 0;
  if (local_c0._M_elems[3]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
       )0x0) {
    (*((Button *)
      local_c0._M_elems[3]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl)->_vptr_Button[1])();
  }
  if (local_c0._M_elems[1]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
       )0x0) {
    (*((Button *)
      local_c0._M_elems[1]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl)->_vptr_Button[1])();
  }
  if (local_c0._M_elems[2]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
       )0x0) {
    (**(code **)(*(long *)local_c0._M_elems[2]._M_t.
                          super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                          .
                          super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                          ._M_head_impl + 8))();
  }
  lVar5 = 0x30;
  do {
    plVar2 = *(long **)((long)&local_88._M_elems[4]._M_t.
                               super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                               .
                               super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                               ._M_head_impl + lVar5);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    *(undefined8 *)
     ((long)&local_88._M_elems[4]._M_t.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
             _M_head_impl + lVar5) = 0;
    lVar5 = lVar5 + -8;
  } while (lVar5 != -8);
  lVar5 = 0x18;
  do {
    plVar2 = *(long **)((long)&local_88._M_elems[0]._M_t.
                               super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                               .
                               super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                               ._M_head_impl + lVar5);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    *(undefined8 *)
     ((long)&local_88._M_elems[0]._M_t.
             super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
             .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
             _M_head_impl + lVar5) = 0;
    lVar5 = lVar5 + -8;
  } while (lVar5 != -8);
  if ((_Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>)
      local_c0._M_elems[0]._M_t.
      super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
      .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
      _M_head_impl !=
      (_Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_c0._M_elems[0]._M_t.
        super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
        ._M_t.
        super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
        .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
        _M_head_impl)[1])();
  }
  return (unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
          )(Context *)
           _Var3.super__Head_base<0UL,_solitaire::interfaces::Context_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<solitaire::interfaces::Context>
ApplicationFactory::makeContext() const
{
    auto solitaire = makeSolitaire();

    Context::FoundationPileColliders foundationPileColliders;
    for (PileId id {0}; id < Solitaire::foundationPilesCount; ++id)
        foundationPileColliders[id] =
            std::make_unique<FoundationPileCollider>(
                Layout::getFoundationPilePosition(id));

    Context::TableauPileColliders tableauPileColliders;
    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id)
        tableauPileColliders[id] =
            std::make_unique<TableauPileCollider>(
                Layout::getTableauPilePosition(id), solitaire->getTableauPile(id));

    return std::make_unique<Context>(
        std::move(solitaire), std::move(foundationPileColliders),
        std::move(tableauPileColliders),
        std::make_unique<StockPileCollider>(solitaire->getStockPile()),
        std::make_unique<Button>(
            Layout::newGameButtonPosition, Layout::newGameButtonSize
        ),
        std::make_unique<Button>(
            Layout::undoButtonPosition, Layout::undoButtonSize
        )
    );
}